

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

void __thiscall diligent_spirv_cross::ParsedIR::fixup_reserved_names(ParsedIR *this)

{
  bool bVar1;
  Types TVar2;
  reference puVar3;
  Variant *this_00;
  SPIRVariable *pSVar4;
  Vector<Decoration> *this_01;
  Decoration *pDVar5;
  Decoration *memb;
  Decoration *__end2;
  Decoration *__begin2;
  Vector<Decoration> *__range2;
  mapped_type *local_38;
  mapped_type *m;
  _Node_iterator_base<unsigned_int,_false> _Stack_28;
  uint32_t id;
  iterator __end1;
  iterator __begin1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range1;
  ParsedIR *this_local;
  
  __end1 = ::std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&this->meta_needing_name_fixup);
  _Stack_28._M_cur =
       (__node_type *)
       ::std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)&this->meta_needing_name_fixup);
  while (bVar1 = ::std::__detail::operator!=
                           (&__end1.super__Node_iterator_base<unsigned_int,_false>,
                            &stack0xffffffffffffffd8), bVar1) {
    puVar3 = ::std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*(&__end1);
    m._4_4_ = *puVar3;
    this_00 = VectorView<diligent_spirv_cross::Variant>::operator[]
                        (&(this->ids).super_VectorView<diligent_spirv_cross::Variant>,(ulong)m._4_4_
                        );
    TVar2 = Variant::get_type(this_00);
    if ((TVar2 != TypeVariable) ||
       (pSVar4 = get<diligent_spirv_cross::SPIRVariable>(this,m._4_4_),
       (pSVar4->remapped_variable & 1U) == 0)) {
      TypedID<(diligent_spirv_cross::Types)0>::TypedID
                ((TypedID<(diligent_spirv_cross::Types)0> *)((long)&__range2 + 4),m._4_4_);
      local_38 = ::std::
                 unordered_map<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>_>
                 ::operator[](&this->meta,(key_type *)((long)&__range2 + 4));
      sanitize_identifier((string *)local_38,false,false);
      this_01 = &local_38->members;
      __end2 = VectorView<diligent_spirv_cross::Meta::Decoration>::begin
                         (&this_01->super_VectorView<diligent_spirv_cross::Meta::Decoration>);
      pDVar5 = VectorView<diligent_spirv_cross::Meta::Decoration>::end
                         (&this_01->super_VectorView<diligent_spirv_cross::Meta::Decoration>);
      for (; __end2 != pDVar5; __end2 = __end2 + 1) {
        sanitize_identifier(&__end2->alias,true,false);
      }
    }
    ::std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end1);
  }
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           *)&this->meta_needing_name_fixup);
  return;
}

Assistant:

void ParsedIR::fixup_reserved_names()
{
	for (uint32_t id : meta_needing_name_fixup)
	{
		// Don't rename remapped variables like 'gl_LastFragDepthARM'.
		if (ids[id].get_type() == TypeVariable && get<SPIRVariable>(id).remapped_variable)
			continue;

		auto &m = meta[id];
		sanitize_identifier(m.decoration.alias, false, false);
		for (auto &memb : m.members)
			sanitize_identifier(memb.alias, true, false);
	}
	meta_needing_name_fixup.clear();
}